

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  ContextType type;
  int iVar6;
  FloatFormat *fmt;
  _Base_ptr p_Var7;
  ostream *poVar8;
  char *pcVar9;
  IVal *pIVar10;
  IVal *value;
  ulong uVar11;
  TestError *this_00;
  IVal *ival;
  size_t size;
  long local_518;
  long local_4f8;
  FuncSet funcs;
  IVal in2;
  FloatFormat highpFmt;
  IVal in3;
  IVal in1;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  ostringstream os;
  ShaderSpec spec;
  ostringstream oss;
  
  size = (long)(inputs->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(inputs->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&outputs,size);
  spec.globalDeclarations._M_dataplus._M_p = (pointer)&spec.globalDeclarations.field_2;
  spec.version = GLSL_VERSION_300_ES;
  spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spec.inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spec.outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spec.globalDeclarations._M_string_length = 0;
  spec.globalDeclarations.field_2._M_local_buf[0] = '\0';
  spec.source._M_dataplus._M_p = (pointer)&spec.source.field_2;
  spec.source._M_string_length = 0;
  spec.source.field_2._M_local_buf[0] = '\0';
  highpFmt.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  highpFmt.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  highpFmt.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  highpFmt.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  highpFmt.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  highpFmt.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  highpFmt.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  highpFmt.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  highpFmt._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &env.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
  std::operator<<((ostream *)puVar2,"Statement: ");
  (*stmt->_vptr_Statement[2])(stmt,puVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  p_Var1 = &funcs._M_t._M_impl.super__Rb_tree_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)funcs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funcs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (*stmt->_vptr_Statement[4])(stmt,&funcs);
  fmt = &(this->m_ctx).floatFormat;
  for (p_Var7 = funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    (**(code **)(**(long **)(p_Var7 + 1) + 0x30))(*(long **)(p_Var7 + 1),&oss);
  }
  if (funcs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)puVar2,(string *)&in1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&in1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree(&funcs._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar8 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,"precision ");
  pcVar9 = glu::getPrecisionName((this->m_ctx).precision);
  poVar8 = std::operator<<(poVar8,pcVar9);
  std::operator<<(poVar8," float;\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&spec.globalDeclarations,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  spec.version = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   "#extension ",&this->m_extension);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&os,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   " : require\n");
    std::__cxx11::string::operator=((string *)&spec.globalDeclarations,(string *)&os);
    std::__cxx11::string::~string((string *)&os);
    std::__cxx11::string::~string((string *)&oss);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&spec.inputs,1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)&os,this,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  ShaderExecUtil::Symbol::operator=
            (spec.inputs.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(Symbol *)&os);
  ShaderExecUtil::Symbol::~Symbol((Symbol *)&os);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&spec.outputs,2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)&os,this,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  ShaderExecUtil::Symbol::operator=
            (spec.outputs.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(Symbol *)&os);
  ShaderExecUtil::Symbol::~Symbol((Symbol *)&os);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)&os,this,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  ShaderExecUtil::Symbol::operator=
            (spec.outputs.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(Symbol *)&os);
  ShaderExecUtil::Symbol::~Symbol((Symbol *)&os);
  de::toString<deqp::gls::BuiltinPrecisionTests::Statement>((string *)&os,stmt);
  std::__cxx11::string::operator=((string *)&spec.source,(string *)&os);
  std::__cxx11::string::~string((string *)&os);
  oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ShaderExecUtil::createExecutor((this->m_ctx).renderContext,(this->m_ctx).shaderType,&spec);
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       (inputs->in0).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (inputs->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (inputs->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  os.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       (inputs->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  funcs._M_t._M_impl._0_8_ =
       outputs.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       outputs.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((ShaderExecutor *)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream)->
    _vptr_ShaderExecutor[3])
            (oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  cVar3 = (**(code **)(*oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                      0x10))();
  if (cVar3 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(*oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream + 0x28))
            ();
  ival = (IVal *)&funcs;
  (**(code **)(*oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream + 0x30))
            (oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,size,&os);
  de::details::
  UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::~UniqueBase((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 *)&oss);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&oss);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)&os);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&funcs);
  Environment::bind<tcu::Vector<float,2>>
            (&env,(variables->in0).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  .m_ptr,(IVal *)&oss);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            (&env,(variables->in1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  .m_ptr,&in1);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            (&env,(variables->in2).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  .m_ptr,&in2);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            (&env,(variables->in3).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  .m_ptr,&in3);
  Environment::bind<tcu::Matrix<float,2,2>>
            (&env,(variables->out0).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  .m_ptr,(IVal *)&os);
  Environment::bind<tcu::Vector<float,2>>
            (&env,(variables->out1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  .m_ptr,(IVal *)&funcs);
  local_4f8 = 0;
  local_518 = 0;
  iVar6 = 0;
  for (uVar11 = 0; size != uVar11; uVar11 = uVar11 + 1) {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)&oss);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&funcs);
    if ((uVar11 & 0xfff) == 0) {
      tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
    }
    round<tcu::Vector<float,2>>
              ((IVal *)&in1,(BuiltinPrecisionTests *)fmt,
               (FloatFormat *)
               ((long)((inputs->in0).
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
               (Vector<float,_2> *)ival);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)&os,fmt,(IVal *)&in1);
    pIVar10 = Environment::lookup<tcu::Vector<float,2>>
                        (&env,(variables->in0).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                              .m_ptr);
    pIVar10->m_data[1].m_lo = (double)os.super_basic_ostream<char,_std::char_traits<char>_>._32_8_;
    pIVar10->m_data[1].m_hi =
         (double)CONCAT44(os.super_basic_ostream<char,_std::char_traits<char>_>._44_4_,
                          os.super_basic_ostream<char,_std::char_traits<char>_>._40_4_);
    pIVar10->m_data[0].m_hi = (double)os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_;
    pIVar10->m_data[1].m_hasNaN = (bool)os.super_basic_ostream<char,_std::char_traits<char>_>._24_1_
    ;
    *(undefined7 *)&pIVar10->m_data[1].field_0x1 =
         os.super_basic_ostream<char,_std::char_traits<char>_>._25_7_;
    *(_func_int ***)pIVar10->m_data =
         os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    pIVar10->m_data[0].m_lo = (double)os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
              (&env,(variables->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                    .m_ptr);
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
              (&env,(variables->in2).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                    .m_ptr);
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
              (&env,(variables->in3).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                    .m_ptr);
    os.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = (this->m_ctx).precision;
    ival = (IVal *)(this->m_ctx).floatFormat.m_maxValue;
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = *(_func_int ***)fmt;
    os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
         (this->m_ctx).floatFormat.m_fractionBits;
    os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
         (this->m_ctx).floatFormat.m_hasSubnormal;
    os.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ =
         (this->m_ctx).floatFormat.m_hasInf;
    os.super_basic_ostream<char,_std::char_traits<char>_>._20_4_ =
         (this->m_ctx).floatFormat.m_hasNaN;
    os.super_basic_ostream<char,_std::char_traits<char>_>._24_1_ =
         (this->m_ctx).floatFormat.m_exactPrecision;
    os.super_basic_ostream<char,_std::char_traits<char>_>._25_7_ =
         *(undefined7 *)&(this->m_ctx).floatFormat.field_0x19;
    os.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0;
    os.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = ival;
    os.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ = &env;
    (*stmt->_vptr_Statement[3])(stmt,(MessageBuilder *)&os);
    pIVar10 = Environment::lookup<tcu::Vector<float,2>>
                        (&env,(variables->out1).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                              .m_ptr);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)&os,&highpFmt,pIVar10);
    funcs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         CONCAT44(os.super_basic_ostream<char,_std::char_traits<char>_>._44_4_,
                  os.super_basic_ostream<char,_std::char_traits<char>_>._40_4_);
    funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)os.super_basic_ostream<char,_std::char_traits<char>_>._32_8_;
    funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_;
    funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)os.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
    funcs._M_t._M_impl._0_8_ =
         os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
    funcs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
    bVar4 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                      ((IVal *)&funcs,
                       (Vector<float,_2> *)
                       ((long)(outputs.out1.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&os,"Shader output 1 is outside acceptable range",(allocator<char> *)&in1);
    bVar4 = tcu::ResultCollector::check(&this->m_status,bVar4,(string *)&os);
    std::__cxx11::string::~string((string *)&os);
    value = Environment::lookup<tcu::Matrix<float,2,2>>
                      (&env,(variables->out0).
                            super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                            .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)&os,&highpFmt,value);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=
              ((Matrix<tcu::Interval,_2,_2> *)&oss,(Matrix<tcu::Interval,_2,_2> *)&os);
    bVar5 = ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doContains
                      ((IVal *)&oss,
                       (Matrix<float,_2,_2> *)
                       ((long)((outputs.out0.
                                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + local_4f8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&os,"Shader output 0 is outside acceptable range",(allocator<char> *)&in1);
    bVar5 = tcu::ResultCollector::check(&this->m_status,bVar5,(string *)&os);
    std::__cxx11::string::~string((string *)&os);
    if ((!bVar4 || !bVar5) && (iVar6 = iVar6 + 1, iVar6 < 0x65)) {
      os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
      std::operator<<((ostream *)puVar2,"Failed");
      std::operator<<((ostream *)puVar2," sample:\n");
      std::operator<<((ostream *)puVar2,"\t");
      std::__cxx11::string::string
                ((string *)&in1,
                 (string *)
                 &((variables->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  .m_ptr)->m_name);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in1);
      std::operator<<((ostream *)puVar2," = ");
      valueToString<tcu::Vector<float,2>>
                ((string *)&in2,(BuiltinPrecisionTests *)&highpFmt,
                 (FloatFormat *)
                 ((long)((inputs->in0).
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                 (Vector<float,_2> *)ival);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in2);
      std::operator<<((ostream *)puVar2,"\n");
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&in1);
      std::operator<<((ostream *)puVar2,"\t");
      std::__cxx11::string::string
                ((string *)&in1,
                 (string *)
                 &((variables->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  .m_ptr)->m_name);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in1);
      std::operator<<((ostream *)puVar2," = ");
      valueToString<tcu::Matrix<float,2,2>>
                ((string *)&in2,(BuiltinPrecisionTests *)&highpFmt,
                 (FloatFormat *)
                 ((long)((outputs.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_4f8),(Matrix<float,_2,_2> *)ival);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in2);
      std::operator<<((ostream *)puVar2,"\n");
      std::operator<<((ostream *)puVar2,"\tExpected range: ");
      intervalToString<tcu::Matrix<float,2,2>>
                ((string *)&in3,(BuiltinPrecisionTests *)&highpFmt,(FloatFormat *)&oss,ival);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in3);
      std::operator<<((ostream *)puVar2,"\n");
      std::__cxx11::string::~string((string *)&in3);
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&in1);
      std::operator<<((ostream *)puVar2,"\t");
      std::__cxx11::string::string
                ((string *)&in1,
                 (string *)
                 &((variables->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  .m_ptr)->m_name);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in1);
      std::operator<<((ostream *)puVar2," = ");
      valueToString<tcu::Vector<float,2>>
                ((string *)&in2,(BuiltinPrecisionTests *)&highpFmt,
                 (FloatFormat *)
                 ((long)(outputs.out1.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_518),
                 (Vector<float,_2> *)ival);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in2);
      std::operator<<((ostream *)puVar2,"\n");
      std::operator<<((ostream *)puVar2,"\tExpected range: ");
      intervalToString<tcu::Vector<float,2>>
                ((string *)&in3,(BuiltinPrecisionTests *)&highpFmt,(FloatFormat *)&funcs,
                 (IVal *)ival);
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::operator<<((ostream *)puVar2,(string *)&in3);
      std::operator<<((ostream *)puVar2,"\n");
      std::__cxx11::string::~string((string *)&in3);
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&in1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    }
    local_518 = local_518 + 8;
    local_4f8 = local_4f8 + 0x10;
  }
  if (iVar6 < 0x65) {
    if (iVar6 == 0) {
      os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
      std::operator<<((ostream *)puVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)puVar2);
      std::operator<<((ostream *)puVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01461798;
    }
  }
  else {
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"(Skipped ");
    std::ostream::operator<<(puVar2,iVar6 + -100);
    std::operator<<((ostream *)puVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
  }
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  puVar2 = &os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
  std::ostream::operator<<(puVar2,iVar6);
  std::operator<<((ostream *)puVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)puVar2);
  std::operator<<((ostream *)puVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&os,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01461798:
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&env);
  ShaderExecUtil::ShaderSpec::~ShaderSpec(&spec);
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  ::~Outputs(&outputs);
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}